

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionExpr.cpp
# Opt level: O3

optional<slang::ast::SequenceRange> __thiscall
slang::ast::SimpleAssertionExpr::computeSequenceLengthImpl(SimpleAssertionExpr *this)

{
  Expression *pEVar1;
  Type *this_00;
  Type *pTVar2;
  ulong uVar3;
  uint uVar4;
  SequenceLengthVisitor *in_RSI;
  ulong uVar5;
  AssertionInstanceExpression *aie;
  optional<slang::ast::SequenceRange> oVar6;
  SequenceRange SVar7;
  
  pEVar1 = this->expr;
  uVar4 = 1;
  if (pEVar1->kind == AssertionInstance) {
    this_00 = (pEVar1->type).ptr;
    pTVar2 = this_00->canonical;
    if (pTVar2 == (Type *)0x0) {
      Type::resolveCanonical(this_00);
      pTVar2 = this_00->canonical;
    }
    if ((pTVar2->super_Symbol).kind == SequenceType) {
      oVar6 = AssertionExpr::visit<(anonymous_namespace)::SequenceLengthVisitor>
                        ((AssertionExpr *)pEVar1[1].type.ptr,in_RSI);
      uVar3 = 1;
      uVar5 = 1;
      if (((undefined1  [16])
           oVar6.super__Optional_base<slang::ast::SequenceRange,_true,_true>._M_payload.
           super__Optional_payload_base<slang::ast::SequenceRange> & (undefined1  [16])0x100000000)
          != (undefined1  [16])0x0) {
        uVar5 = oVar6.super__Optional_base<slang::ast::SequenceRange,_true,_true>._M_payload.
                super__Optional_payload_base<slang::ast::SequenceRange>._M_payload._0_8_ >> 0x20;
        uVar4 = oVar6.super__Optional_base<slang::ast::SequenceRange,_true,_true>._M_payload.
                super__Optional_payload_base<slang::ast::SequenceRange>._M_payload._8_4_;
        uVar3 = oVar6.super__Optional_base<slang::ast::SequenceRange,_true,_true>._M_payload.
                super__Optional_payload_base<slang::ast::SequenceRange>._M_payload._0_8_ &
                0xffffffff;
      }
      goto LAB_004073a8;
    }
  }
  uVar3 = 1;
  uVar5 = 1;
LAB_004073a8:
  if ((this->repetition).super__Optional_base<slang::ast::SequenceRepetition,_true,_true>._M_payload
      .super__Optional_payload_base<slang::ast::SequenceRepetition>._M_engaged == true) {
    SVar7._0_8_ = uVar3 | uVar5 << 0x20;
    SVar7.max.super__Optional_base<unsigned_int,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_int>._4_4_ = uVar4;
    SVar7 = SequenceRepetition::applyTo((SequenceRepetition *)&this->repetition,SVar7);
    uVar3 = SVar7._0_8_;
    uVar5 = uVar3 >> 0x20;
    uVar4 = SVar7.max.super__Optional_base<unsigned_int,_true,_true>._M_payload.
            super__Optional_payload_base<unsigned_int>._4_4_ & 0xff;
  }
  oVar6.super__Optional_base<slang::ast::SequenceRange,_true,_true>._M_payload.
  super__Optional_payload_base<slang::ast::SequenceRange>._M_payload._0_8_ =
       uVar3 & 0xffffffff | uVar5 << 0x20;
  oVar6.super__Optional_base<slang::ast::SequenceRange,_true,_true>._M_payload.
  super__Optional_payload_base<slang::ast::SequenceRange>._8_8_ = (ulong)uVar4 | 0x100000000;
  return (optional<slang::ast::SequenceRange>)
         oVar6.super__Optional_base<slang::ast::SequenceRange,_true,_true>._M_payload.
         super__Optional_payload_base<slang::ast::SequenceRange>;
}

Assistant:

std::optional<SequenceRange> SimpleAssertionExpr::computeSequenceLengthImpl() const {
    SequenceRange res;
    res.min = 1;
    res.max = 1;

    if (expr.kind == ExpressionKind::AssertionInstance) {
        if (auto& aie = expr.as<AssertionInstanceExpression>(); aie.type->isSequenceType()) {
            if (auto aieSeqLength = aie.body.computeSequenceLength())
                res = *aieSeqLength;
        }
    }

    if (repetition)
        res = repetition->applyTo(res);

    return res;
}